

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

int Cof_ObjLevel(Cof_Man_t *p,Cof_Obj_t *pObj)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  size_t __size;
  int iVar6;
  int iVar7;
  
  uVar2 = pObj->Id;
  if (((int)uVar2 < 0) || (p->pGia->nObjs <= (int)uVar2)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pVVar4 = p->pGia->vLevels;
  if ((int)uVar2 < pVVar4->nSize) goto LAB_0070c611;
  lVar1 = (ulong)uVar2 + 1;
  iVar3 = pVVar4->nCap;
  iVar6 = iVar3 * 2;
  iVar7 = (int)lVar1;
  if ((int)uVar2 < iVar6) {
    if (iVar3 < iVar6 && iVar3 <= (int)uVar2) {
      if (pVVar4->pArray == (int *)0x0) {
        piVar5 = (int *)malloc((long)iVar3 << 3);
      }
      else {
        piVar5 = (int *)realloc(pVVar4->pArray,(long)iVar3 << 3);
      }
      pVVar4->pArray = piVar5;
LAB_0070c5db:
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar4->nCap = iVar6;
    }
  }
  else if (iVar3 <= (int)uVar2) {
    __size = lVar1 * 4;
    if (pVVar4->pArray == (int *)0x0) {
      piVar5 = (int *)malloc(__size);
    }
    else {
      piVar5 = (int *)realloc(pVVar4->pArray,__size);
    }
    pVVar4->pArray = piVar5;
    iVar6 = iVar7;
    goto LAB_0070c5db;
  }
  iVar3 = pVVar4->nSize;
  if (iVar3 <= (int)uVar2) {
    memset(pVVar4->pArray + iVar3,0,(ulong)(uVar2 - iVar3) * 4 + 4);
  }
  pVVar4->nSize = iVar7;
LAB_0070c611:
  if ((int)uVar2 < pVVar4->nSize) {
    return pVVar4->pArray[uVar2];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int         Cof_ObjLevel( Cof_Man_t * p, Cof_Obj_t * pObj )             { return Gia_ObjLevel(p->pGia, Gia_ManObj(p->pGia,pObj->Id)); }